

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propertyprinter.cpp
# Opt level: O1

void jsonPropertyPrinter(QList<std::pair<QString,_QString>_> *values)

{
  size_t sVar1;
  pair<QString,_QString> *val;
  pair<QString,_QString> *ppVar2;
  long lVar3;
  long in_FS_OFFSET;
  QJsonDocument document;
  QJsonObject object;
  undefined1 *local_58;
  undefined1 *local_50;
  QArrayData *local_48;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)&local_50);
  lVar3 = (values->d).size;
  if (lVar3 != 0) {
    ppVar2 = (values->d).ptr;
    lVar3 = lVar3 * 0x30;
    do {
      QJsonValue::QJsonValue((QJsonValue *)&local_48,(QString *)&ppVar2->second);
      QJsonObject::insert((QString *)&local_50,(QJsonValue *)ppVar2);
      QJsonValue::~QJsonValue((QJsonValue *)&local_48);
      ppVar2 = ppVar2 + 1;
      lVar3 = lVar3 + -0x30;
    } while (lVar3 != 0);
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonDocument::QJsonDocument((QJsonDocument *)&local_58,(QJsonObject *)&local_50);
  QJsonDocument::toJson(&local_48,&local_58,0);
  if (local_40 == (char *)0x0) {
    local_40 = (char *)&QByteArray::_empty;
  }
  sVar1 = strlen(local_40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_40,sVar1);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,1,0x10);
    }
  }
  QJsonDocument::~QJsonDocument((QJsonDocument *)&local_58);
  QJsonObject::~QJsonObject((QJsonObject *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void jsonPropertyPrinter(const QList<QPair<QString, QString>> &values)
{
    QJsonObject object;
    for (const auto &val : values)
        object.insert(val.first, val.second);

    QJsonDocument document(object);
    std::cout << document.toJson().constData();
}